

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

ArrayIndex __thiscall
anon_unknown.dwarf_b38497::CodemodelConfig::GetDirectoryIndex
          (CodemodelConfig *this,cmStateSnapshot s)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator i;
  CodemodelConfig *this_local;
  
  i._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
       ::find(&this->DirectoryMap,&s);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
       ::end(&this->DirectoryMap);
  bVar1 = std::operator!=(&local_18,&local_20);
  if (!bVar1) {
    __assert_fail("i != this->DirectoryMap.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileAPICodemodel.cxx"
                  ,0x1be,
                  "Json::ArrayIndex (anonymous namespace)::CodemodelConfig::GetDirectoryIndex(cmStateSnapshot)"
                 );
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_cmStateSnapshot,_unsigned_int>_>::operator->
                     (&local_18);
  return ppVar2->second;
}

Assistant:

Json::ArrayIndex CodemodelConfig::GetDirectoryIndex(cmStateSnapshot s)
{
  auto i = this->DirectoryMap.find(s);
  assert(i != this->DirectoryMap.end());
  return i->second;
}